

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawCircle
          (PixelGameEngine *this,int32_t x,int32_t y,int32_t radius,Pixel p,uint8_t mask)

{
  int32_t iVar1;
  int iVar2;
  int local_34;
  int local_30;
  int d;
  int y0;
  int x0;
  uint8_t mask_local;
  int32_t radius_local;
  int32_t y_local;
  int32_t x_local;
  PixelGameEngine *this_local;
  Pixel p_local;
  
  if ((((-1 < radius) && (SBORROW4(x,-radius) == x + radius < 0)) && (-radius <= y)) &&
     ((iVar1 = GetDrawTargetWidth(this), x - iVar1 <= radius &&
      (iVar1 = GetDrawTargetHeight(this), y - iVar1 <= radius)))) {
    if (radius < 1) {
      (*this->_vptr_PixelGameEngine[5])(this,(ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)p.field_0);
    }
    else {
      local_34 = radius * -2 + 3;
      local_30 = radius;
      for (d = 0; d <= local_30; d = d + 1) {
        if ((mask & 1) != 0) {
          (*this->_vptr_PixelGameEngine[5])
                    (this,(ulong)(uint)(x + d),(ulong)(uint)(y - local_30),(ulong)(uint)p.field_0);
        }
        if ((mask & 4) != 0) {
          (*this->_vptr_PixelGameEngine[5])
                    (this,(ulong)(uint)(x + local_30),(ulong)(uint)(y + d),(ulong)(uint)p.field_0);
        }
        if ((mask & 0x10) != 0) {
          (*this->_vptr_PixelGameEngine[5])
                    (this,(ulong)(uint)(x - d),(ulong)(uint)(y + local_30),(ulong)(uint)p.field_0);
        }
        if ((mask & 0x40) != 0) {
          (*this->_vptr_PixelGameEngine[5])
                    (this,(ulong)(uint)(x - local_30),(ulong)(uint)(y - d),(ulong)(uint)p.field_0);
        }
        if ((d != 0) && (d != local_30)) {
          if ((mask & 2) != 0) {
            (*this->_vptr_PixelGameEngine[5])
                      (this,(ulong)(uint)(x + local_30),(ulong)(uint)(y - d),(ulong)(uint)p.field_0)
            ;
          }
          if ((mask & 8) != 0) {
            (*this->_vptr_PixelGameEngine[5])
                      (this,(ulong)(uint)(x + d),(ulong)(uint)(y + local_30),(ulong)(uint)p.field_0)
            ;
          }
          if ((mask & 0x20) != 0) {
            (*this->_vptr_PixelGameEngine[5])
                      (this,(ulong)(uint)(x - local_30),(ulong)(uint)(y + d),(ulong)(uint)p.field_0)
            ;
          }
          if ((mask & 0x80) != 0) {
            (*this->_vptr_PixelGameEngine[5])
                      (this,(ulong)(uint)(x - d),(ulong)(uint)(y - local_30),(ulong)(uint)p.field_0)
            ;
          }
        }
        if (local_34 < 0) {
          iVar2 = d * 4 + 6;
        }
        else {
          iVar2 = (d - local_30) * 4 + 10;
          local_30 = local_30 + -1;
        }
        local_34 = iVar2 + local_34;
      }
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawCircle(int32_t x, int32_t y, int32_t radius, Pixel p, uint8_t mask)
	{ // Thanks to IanM-Matrix1 #PR121
		if (radius < 0 || x < -radius || y < -radius || x - GetDrawTargetWidth() > radius || y - GetDrawTargetHeight() > radius)
			return;

		if (radius > 0)
		{
			int x0 = 0;
			int y0 = radius;
			int d = 3 - 2 * radius;

			while (y0 >= x0) // only formulate 1/8 of circle
			{
				// Draw even octants
				if (mask & 0x01) Draw(x + x0, y - y0, p);// Q6 - upper right right
				if (mask & 0x04) Draw(x + y0, y + x0, p);// Q4 - lower lower right
				if (mask & 0x10) Draw(x - x0, y + y0, p);// Q2 - lower left left
				if (mask & 0x40) Draw(x - y0, y - x0, p);// Q0 - upper upper left
				if (x0 != 0 && x0 != y0)
				{
					if (mask & 0x02) Draw(x + y0, y - x0, p);// Q7 - upper upper right
					if (mask & 0x08) Draw(x + x0, y + y0, p);// Q5 - lower right right
					if (mask & 0x20) Draw(x - y0, y + x0, p);// Q3 - lower lower left
					if (mask & 0x80) Draw(x - x0, y - y0, p);// Q1 - upper left left
				}

				if (d < 0)
					d += 4 * x0++ + 6;
				else
					d += 4 * (x0++ - y0--) + 10;
			}
		}
		else
			Draw(x, y, p);
	}